

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O2

void LDLSolve(c_float *x,c_float *b,csc *L,c_float *Dinv,c_int *P,c_float *bp)

{
  permute_x(L->n,bp,b,P);
  QDLDL_solve(L->n,L->p,L->i,L->x,Dinv,bp);
  permutet_x(L->n,x,bp,P);
  return;
}

Assistant:

static void LDLSolve(c_float *x, c_float *b, const csc *L, const c_float *Dinv, const c_int *P, c_float *bp) {
    /* solves P'LDL'P x = b for x */
    permute_x(L->n, bp, b, P);
    QDLDL_solve(L->n, L->p, L->i, L->x, Dinv, bp);
    permutet_x(L->n, x, bp, P);

}